

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_recoverable_signature_serialize_compact
              (secp256k1_context *ctx,uchar *output64,int *recid,
              secp256k1_ecdsa_recoverable_signature *sig)

{
  secp256k1_ecdsa_recoverable_signature *in_RCX;
  int *in_RDX;
  long in_RSI;
  secp256k1_context *in_RDI;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar *in_stack_ffffffffffffff98;
  secp256k1_callback *in_stack_ffffffffffffffa0;
  secp256k1_scalar local_48 [2];
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RCX == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else if (in_RDX == (int *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
    local_4 = 0;
  }
  else {
    secp256k1_ecdsa_recoverable_signature_load
              (in_RDI,local_48,(secp256k1_scalar *)&stack0xffffffffffffff98,in_RDX,in_RCX);
    secp256k1_scalar_get_b32((uchar *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    secp256k1_scalar_get_b32((uchar *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_ecdsa_recoverable_signature_serialize_compact(const secp256k1_context* ctx, unsigned char *output64, int *recid, const secp256k1_ecdsa_recoverable_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output64 != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(recid != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, recid, sig);
    secp256k1_scalar_get_b32(&output64[0], &r);
    secp256k1_scalar_get_b32(&output64[32], &s);
    return 1;
}